

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cpp
# Opt level: O0

size_type fs_filesystem_type(char *path,char *result,size_type buffer_size)

{
  size_type sVar1;
  string_view local_60;
  string local_50;
  string_view local_30;
  size_type local_20;
  size_type buffer_size_local;
  char *result_local;
  char *path_local;
  
  local_20 = buffer_size;
  buffer_size_local = (size_type)result;
  result_local = path;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,path);
  fs_filesystem_type_abi_cxx11_(&local_50,local_60);
  local_30 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
  sVar1 = fs_str2char(local_30,(char *)buffer_size_local,local_20);
  std::__cxx11::string::~string((string *)&local_50);
  return sVar1;
}

Assistant:

std::string::size_type fs_filesystem_type(const char* path,
                         char* result, const std::string::size_type buffer_size){
  return fs_str2char(fs_filesystem_type(path), result, buffer_size);
}